

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O2

void jsons_print_anydata(lyout *out,lys_node *node,int *first)

{
  char *__s1;
  int iVar1;
  lys_node *plVar2;
  char *val;
  lys_module *plVar3;
  
  plVar2 = lys_parent(node);
  __s1 = node->name;
  if (plVar2 == (lys_node *)0x0) {
    iVar1 = strcmp(__s1,"config");
    if (iVar1 == 0) {
      iVar1 = strcmp(node->module->name,"ietf-netconf");
      if (iVar1 == 0) {
        return;
      }
    }
  }
  val = jsons_nodetype_str(node->nodetype);
  jsons_print_object(out,__s1,"nodetype",val,0,first);
  plVar3 = lys_main_module(node->module);
  ly_print(out,",\"module\":\"%s\"",plVar3->name);
  if ((node->module->field_0x40 & 1) != 0) {
    ly_print(out,",\"included-from\":\"%s\"",node->module->name);
  }
  jsons_print_text(out,"description","text",node->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",node->ref,1,(int *)0x0);
  jsons_print_config(out,node->flags,(int *)0x0);
  jsons_print_status(out,node->flags,(int *)0x0);
  jsons_print_mand(out,node->flags,(int *)0x0);
  jsons_print_iffeatures(out,node->module,node->iffeature,node->iffeature_size,(int *)0x0);
  jsons_print_when(out,(lys_when *)node[1].name,(int *)0x0);
  jsons_print_musts(out,(lys_restr *)node[1].dsc,node->padding[3],(int *)0x0);
  ly_print(out,"}");
  return;
}

Assistant:

static void
jsons_print_anydata(struct lyout *out, const struct lys_node *node, int *first)
{
    struct lys_node_anydata *any = (struct lys_node_anydata *)node;

    if (!lys_parent(node) && !strcmp(node->name, "config") && !strcmp(node->module->name, "ietf-netconf")) {
        /* node added by libyang, not actually in the model */
        return;
    }

    jsons_print_object(out, node->name, "nodetype", jsons_nodetype_str(node->nodetype), 0, first);
    ly_print(out, ",\"module\":\"%s\"", lys_main_module(node->module)->name);
    if (node->module->type) {
        ly_print(out, ",\"included-from\":\"%s\"", node->module->name);
    }
    jsons_print_text(out, "description", "text", any->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", any->ref, 1, NULL);
    jsons_print_config(out, any->flags, NULL);
    jsons_print_status(out, any->flags, NULL);
    jsons_print_mand(out, any->flags, NULL);
    jsons_print_iffeatures(out, any->module, any->iffeature, any->iffeature_size, NULL);
    jsons_print_when(out, any->when, NULL);
    jsons_print_musts(out, any->must, any->must_size, NULL);

    /* TODO print content */

    ly_print(out, "}");
}